

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

bool __thiscall choc::value::Type::ComplexArray::usesStrings(ComplexArray *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  RepeatedGroup *g;
  RepeatedGroup *pRVar4;
  
  pRVar4 = (this->groups).items;
  lVar1 = (ulong)(this->groups).size * 0x28;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0) break;
    bVar2 = Type::usesStrings(&pRVar4->elementType);
    pRVar4 = pRVar4 + 1;
    lVar1 = lVar3 + -0x28;
  } while (!bVar2);
  return lVar3 != 0;
}

Assistant:

ObjectType* end() const                     { return items + size; }